

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess-posix.cc
# Opt level: O0

ExitStatus __thiscall Subprocess::Finish(Subprocess *this)

{
  uint uVar1;
  __pid_t _Var2;
  int *piVar3;
  char *pcVar4;
  uint local_1c;
  int exit;
  int status;
  Subprocess *this_local;
  
  _exit = this;
  if (this->pid_ == -1) {
    __assert_fail("pid_ != -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess-posix.cc"
                  ,0x98,"ExitStatus Subprocess::Finish()");
  }
  _Var2 = waitpid(this->pid_,(int *)&local_1c,0);
  if (-1 < _Var2) {
    this->pid_ = -1;
    if ((local_1c & 0x7f) == 0) {
      if ((int)(local_1c & 0xff00) >> 8 == 0) {
        return ExitSuccess;
      }
    }
    else if (('\0' < (char)(((byte)local_1c & 0x7f) + 1) >> 1) &&
            ((((local_1c & 0x7f) == 2 || ((local_1c & 0x7f) == 0xf)) || ((local_1c & 0x7f) == 1))))
    {
      return ExitInterrupted;
    }
    return ExitFailure;
  }
  uVar1 = this->pid_;
  piVar3 = __errno_location();
  pcVar4 = strerror(*piVar3);
  Fatal("waitpid(%d): %s",(ulong)uVar1,pcVar4);
}

Assistant:

ExitStatus Subprocess::Finish() {
  assert(pid_ != -1);
  int status;
  if (waitpid(pid_, &status, 0) < 0)
    Fatal("waitpid(%d): %s", pid_, strerror(errno));
  pid_ = -1;

#ifdef _AIX
  if (WIFEXITED(status) && WEXITSTATUS(status) & 0x80) {
    // Map the shell's exit code used for signal failure (128 + signal) to the
    // status code expected by AIX WIFSIGNALED and WTERMSIG macros which, unlike
    // other systems, uses a different bit layout.
    int signal = WEXITSTATUS(status) & 0x7f;
    status = (signal << 16) | signal;
  }
#endif

  if (WIFEXITED(status)) {
    int exit = WEXITSTATUS(status);
    if (exit == 0)
      return ExitSuccess;
  } else if (WIFSIGNALED(status)) {
    if (WTERMSIG(status) == SIGINT || WTERMSIG(status) == SIGTERM
        || WTERMSIG(status) == SIGHUP)
      return ExitInterrupted;
  }
  return ExitFailure;
}